

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O1

vector<long_long,_std::allocator<long_long>_> *
cppqc::shrinkIntegral<long_long>
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,longlong x)

{
  longlong lVar1;
  iterator iVar2;
  long lVar3;
  ulong uVar4;
  longlong local_28;
  
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (x < 0) {
    lVar1 = 0x7fffffffffffffff;
    if (x == -0x8000000000000000) {
      local_28 = 0x7fffffffffffffff;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (__return_storage_ptr__,iVar2,&local_28);
        goto LAB_001d805f;
      }
    }
    else {
      lVar1 = -x;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_28 = lVar1;
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (__return_storage_ptr__,iVar2,&local_28);
        goto LAB_001d805f;
      }
    }
    *iVar2._M_current = lVar1;
    (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
LAB_001d805f:
  lVar3 = x;
  if (x != 0) {
    do {
      local_28 = x - lVar3;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (__return_storage_ptr__,iVar2,&local_28);
      }
      else {
        *iVar2._M_current = local_28;
        (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar4 = lVar3 + 1;
      lVar3 = lVar3 / 2;
    } while (2 < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}